

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

void __thiscall Arena::free(Arena *this,void *__ptr)

{
  long lVar1;
  bool bVar2;
  runtime_error *this_00;
  mapped_type *pmVar3;
  long in_FS_OFFSET;
  iterator it;
  iterator next;
  iterator prev;
  pair<char_*,_unsigned_long> freed;
  iterator i;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_> *in_stack_fffffffffffffed8;
  unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
  *in_stack_fffffffffffffee0;
  SizeToChunkSortedMap *in_stack_fffffffffffffee8;
  SizeToChunkSortedMap *in_stack_fffffffffffffef0;
  _Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
  in_stack_fffffffffffffef8;
  _Base_ptr local_b0;
  _Base_ptr local_a0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (__ptr != (void *)0x0) {
    std::
    unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
    ::find((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
            *)in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->_M_node);
    std::
    unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
    ::end((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
           *)in_stack_fffffffffffffee0);
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> *)
                       in_stack_fffffffffffffee8,
                       (_Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> *)
                       in_stack_fffffffffffffee0);
    if (bVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Arena: invalid or double free");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_003c4d63;
    }
    std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>::operator->
              ((_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> *)
               in_stack_fffffffffffffed8);
    std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>::operator->
              ((_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> *)
               in_stack_fffffffffffffed8);
    std::make_pair<char*,unsigned_long&>
              ((char **)in_stack_fffffffffffffee8,(unsigned_long *)in_stack_fffffffffffffee0);
    std::
    unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
    ::erase((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
             *)in_stack_fffffffffffffee0,(iterator)in_stack_fffffffffffffef8._M_cur);
    std::
    unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
    ::find(in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->_M_node);
    std::
    unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
    ::end(in_stack_fffffffffffffee0);
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
                        *)in_stack_fffffffffffffee8,
                       (_Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
                        *)in_stack_fffffffffffffee0);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::__detail::
      _Node_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
                    *)in_stack_fffffffffffffed8);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>::operator->
                (in_stack_fffffffffffffed8);
      std::__detail::
      _Node_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
                    *)in_stack_fffffffffffffed8);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>::operator->
                (in_stack_fffffffffffffed8);
      in_stack_fffffffffffffef0 = &this->size_to_free_chunk;
      std::__detail::
      _Node_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
                    *)in_stack_fffffffffffffed8);
      std::
      multimap<unsigned_long,_void_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
      ::erase((multimap<unsigned_long,_void_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
               *)in_stack_fffffffffffffee0,(const_iterator)in_stack_fffffffffffffef8._M_cur);
      std::
      unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
      ::erase(in_stack_fffffffffffffee0,(iterator)in_stack_fffffffffffffef8._M_cur);
    }
    std::
    unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
    ::find(in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->_M_node);
    std::
    unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
    ::end(in_stack_fffffffffffffee0);
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
                        *)in_stack_fffffffffffffee8,
                       (_Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
                        *)in_stack_fffffffffffffee0);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::__detail::
      _Node_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
                    *)in_stack_fffffffffffffed8);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>::operator->
                (in_stack_fffffffffffffed8);
      in_stack_fffffffffffffee8 = &this->size_to_free_chunk;
      std::__detail::
      _Node_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>
                    *)in_stack_fffffffffffffed8);
      std::
      multimap<unsigned_long,_void_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
      ::erase((multimap<unsigned_long,_void_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
               *)in_stack_fffffffffffffee0,(const_iterator)in_stack_fffffffffffffef8._M_cur);
      std::
      unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
      ::erase(in_stack_fffffffffffffee0,(iterator)in_stack_fffffffffffffef8._M_cur);
    }
    std::
    multimap<unsigned_long,void*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
    ::emplace<unsigned_long&,char*&>
              (in_stack_fffffffffffffef0,(unsigned_long *)in_stack_fffffffffffffee8,
               (char **)in_stack_fffffffffffffee0);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>::_Rb_tree_const_iterator
              (in_stack_fffffffffffffed8,(iterator *)0x3c4ca8);
    pmVar3 = std::
             unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
             ::operator[]((unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
                           *)in_stack_fffffffffffffee8,(key_type *)in_stack_fffffffffffffee0);
    pmVar3->_M_node = local_a0;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>::_Rb_tree_const_iterator
              (in_stack_fffffffffffffed8,(iterator *)0x3c4ceb);
    pmVar3 = std::
             unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
             ::operator[]((unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
                           *)in_stack_fffffffffffffee8,(key_type *)in_stack_fffffffffffffee0);
    pmVar3->_M_node = local_b0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_003c4d63:
  __stack_chk_fail();
}

Assistant:

void Arena::free(void *ptr)
{
    // Freeing the nullptr pointer is OK.
    if (ptr == nullptr) {
        return;
    }

    // Remove chunk from used map
    auto i = chunks_used.find(ptr);
    if (i == chunks_used.end()) {
        throw std::runtime_error("Arena: invalid or double free");
    }
    auto freed = std::make_pair(static_cast<char*>(i->first), i->second);
    chunks_used.erase(i);

    // coalesce freed with previous chunk
    auto prev = chunks_free_end.find(freed.first);
    if (prev != chunks_free_end.end()) {
        freed.first -= prev->second->first;
        freed.second += prev->second->first;
        size_to_free_chunk.erase(prev->second);
        chunks_free_end.erase(prev);
    }

    // coalesce freed with chunk after freed
    auto next = chunks_free.find(freed.first + freed.second);
    if (next != chunks_free.end()) {
        freed.second += next->second->first;
        size_to_free_chunk.erase(next->second);
        chunks_free.erase(next);
    }

    // Add/set space with coalesced free chunk
    auto it = size_to_free_chunk.emplace(freed.second, freed.first);
    chunks_free[freed.first] = it;
    chunks_free_end[freed.first + freed.second] = it;
}